

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

void __thiscall spvtools::opt::MergeReturnPass::AddReturnFlag(MergeReturnPass *this)

{
  TypeManager *this_00;
  ConstantManager *this_01;
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> _Var1;
  Analysis AVar2;
  uint32_t uVar3;
  int iVar4;
  array<signed_char,_4UL> aVar5;
  uint32_t res_id;
  Type *pTVar6;
  undefined4 extraout_var;
  Constant *c;
  Instruction *pIVar7;
  tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_> *ptVar8;
  iterator inst;
  IRContext *pIVar9;
  IRContext *this_02;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_03;
  long lVar10;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  returnFlag;
  iterator insert_iter;
  Bool temp;
  undefined1 local_120 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_100;
  undefined1 local_f8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_d8;
  undefined1 local_d0 [16];
  pointer local_c0;
  uint local_b8 [2];
  uint *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined1 local_98 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_78;
  Type local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->return_flag_ != (Instruction *)0x0) {
    return;
  }
  pIVar9 = (this->super_MemPass).super_Pass.context_;
  AVar2 = pIVar9->valid_analyses_;
  this_02 = pIVar9;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(pIVar9);
    this_02 = (this->super_MemPass).super_Pass.context_;
    AVar2 = this_02->valid_analyses_;
  }
  this_00 = (pIVar9->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(this_02);
  }
  this_01 = (this_02->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  local_70.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.kind_ = kBool;
  local_70._vptr_Type = (_func_int **)&PTR__Type_003d8d10;
  uVar3 = analysis::TypeManager::GetTypeInstruction(this_00,&local_70);
  pTVar6 = analysis::TypeManager::GetType(this_00,uVar3);
  iVar4 = (*pTVar6->_vptr_Type[7])(pTVar6);
  local_d0._0_8_ = operator_new(4);
  local_d0._8_8_ =
       (long)&(((Instruction *)local_d0._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              ._vptr_IntrusiveNodeBase + 4;
  *(uint *)&(((Instruction *)local_d0._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            _vptr_IntrusiveNodeBase = 0;
  local_c0 = (pointer)local_d0._8_8_;
  c = analysis::ConstantManager::GetConstant
                (this_01,(Type *)CONCAT44(extraout_var,iVar4),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
  if ((Instruction *)local_d0._0_8_ != (Instruction *)0x0) {
    operator_delete((void *)local_d0._0_8_,(long)local_c0 - local_d0._0_8_);
  }
  aVar5._M_elems[0] = '\0';
  aVar5._M_elems[1] = '\0';
  aVar5._M_elems[2] = '\0';
  aVar5._M_elems[3] = '\0';
  pIVar7 = analysis::ConstantManager::GetDefiningInstruction(this_01,c,0,(inst_iterator *)0x0);
  if (pIVar7->has_result_id_ == true) {
    aVar5._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  uVar3 = analysis::TypeManager::FindPointerToType(this_00,uVar3,Function);
  res_id = Pass::TakeNextId((Pass *)this);
  pIVar7 = (Instruction *)operator_new(0x70);
  pIVar9 = (this->super_MemPass).super_Pass.context_;
  local_120._24_8_ = local_120 + 0x10;
  local_120._0_8_ = &PTR__SmallVector_003d7c78;
  local_100._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_120[0x10] = '\a';
  local_120[0x11] = '\0';
  local_120[0x12] = '\0';
  local_120[0x13] = '\0';
  local_120._8_8_ = 1;
  local_d0._0_4_ = 0x11;
  local_d0._8_8_ = &PTR__SmallVector_003d7c78;
  local_c0 = (pointer)0x0;
  local_b0 = local_b8;
  local_a8 = 0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_d0 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_120);
  local_f8._24_8_ = local_f8 + 0x10;
  local_f8._0_8_ = &PTR__SmallVector_003d7c78;
  local_d8._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_f8._8_8_ = 1;
  local_a0 = 1;
  local_98._0_8_ = &PTR__SmallVector_003d7c78;
  local_98._8_8_ = 0;
  local_98._24_8_ = local_98 + 0x10;
  this_03 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_78;
  local_78._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_f8._16_4_ = aVar5._M_elems;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_98,(SmallVector<unsigned_int,_2UL> *)local_f8);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_d0,&local_70);
  Instruction::Instruction(pIVar7,pIVar9,OpVariable,uVar3,res_id,(OperandList *)&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  lVar10 = -0x60;
  do {
    *(undefined ***)(this_03 + -0x20) = &PTR__SmallVector_003d7c78;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_03 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_03,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_03);
    }
    *(undefined8 *)this_03 = 0;
    this_03 = this_03 + -0x30;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0);
  local_f8._0_8_ = &PTR__SmallVector_003d7c78;
  if (local_d8._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_d8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_d8._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_120._0_8_ = &PTR__SmallVector_003d7c78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_100._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_100,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_100._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_120._0_8_ =
       *(undefined8 *)
        ((long)(((this->function_->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t + 0x20);
  InstructionList::iterator::InsertBefore
            ((iterator *)local_d0,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)local_120);
  pIVar9 = (this->super_MemPass).super_Pass.context_;
  _Var1._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (((this->function_->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  inst.node_ = *(Instruction **)
                ((long)_Var1._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl +
                0x20);
  this->return_flag_ = inst.node_;
  AVar2 = pIVar9->valid_analyses_;
  if ((AVar2 & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar9->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst.node_);
    pIVar9 = (this->super_MemPass).super_Pass.context_;
    inst.node_ = this->return_flag_;
    AVar2 = pIVar9->valid_analyses_;
  }
  local_d0._0_8_ = inst.node_;
  if ((AVar2 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ptVar8 = (tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_> *)
             std::__detail::
             _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pIVar9->instr_to_block_,(key_type *)local_d0);
    ptVar8->
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         = (_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            )_Var1._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  }
  if (pIVar7 != (Instruction *)0x0) {
    (*(pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])();
  }
  local_70._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_70.decorations_);
  return;
}

Assistant:

void MergeReturnPass::AddReturnFlag() {
  if (return_flag_) return;

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  analysis::Bool temp;
  uint32_t bool_id = type_mgr->GetTypeInstruction(&temp);
  analysis::Bool* bool_type = type_mgr->GetType(bool_id)->AsBool();

  const analysis::Constant* false_const =
      const_mgr->GetConstant(bool_type, {false});
  uint32_t const_false_id =
      const_mgr->GetDefiningInstruction(false_const)->result_id();

  uint32_t bool_ptr_id =
      type_mgr->FindPointerToType(bool_id, spv::StorageClass::Function);

  uint32_t var_id = TakeNextId();
  std::unique_ptr<Instruction> returnFlag(new Instruction(
      context(), spv::Op::OpVariable, bool_ptr_id, var_id,
      std::initializer_list<Operand>{{SPV_OPERAND_TYPE_STORAGE_CLASS,
                                      {uint32_t(spv::StorageClass::Function)}},
                                     {SPV_OPERAND_TYPE_ID, {const_false_id}}}));

  auto insert_iter = function_->begin()->begin();

  insert_iter.InsertBefore(std::move(returnFlag));
  BasicBlock* entry_block = &*function_->begin();
  return_flag_ = &*entry_block->begin();
  context()->AnalyzeDefUse(return_flag_);
  context()->set_instr_block(return_flag_, entry_block);
}